

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O1

void __thiscall
sfc::Subpalette::add(Subpalette *this,rgba_vec_t *new_colors,bool add_duplicates,bool overwrite)

{
  pointer puVar1;
  rgba_t *prVar2;
  undefined3 in_register_00000009;
  rgba_t *prVar3;
  
  if (CONCAT31(in_register_00000009,overwrite) != 0) {
    puVar1 = (this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->_colors).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->_colors_set)._M_t);
  }
  prVar2 = (new_colors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (prVar3 = (new_colors->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; prVar3 != prVar2; prVar3 = prVar3 + 1) {
    add(this,*prVar3,add_duplicates);
  }
  return;
}

Assistant:

void Subpalette::add(const rgba_vec_t& new_colors, bool add_duplicates, bool overwrite) {
  if (overwrite) {
    _colors.clear();
    _colors_set.clear();
  }
  for (auto c : new_colors)
    add(c, add_duplicates);
}